

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int vorbis_finish_frame(stb_vorbis *f,int len,int left,int right)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = f->previous_length;
  if ((long)(int)uVar1 == 0) {
    uVar5 = f->channels;
  }
  else {
    lVar6 = 0x5b8;
    if ((uVar1 * 2 != f->blocksize_0) && (lVar6 = 0x5c0, uVar1 * 2 != f->blocksize_1)) {
      return 0;
    }
    lVar6 = *(long *)((long)&f->sample_rate + lVar6);
    if (lVar6 == 0) {
      return 0;
    }
    uVar5 = f->channels;
    if ((long)(int)uVar5 < 1) {
      f->previous_length = len - right;
      goto LAB_0015e420;
    }
    lVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        pfVar2 = f->previous_window[lVar8];
        pfVar3 = f->channel_buffers[lVar8];
        uVar4 = 0;
        lVar7 = (long)(int)uVar1;
        do {
          lVar7 = lVar7 + -1;
          pfVar3[(long)left + uVar4] =
               pfVar3[(long)left + uVar4] * *(float *)(lVar6 + uVar4 * 4) +
               pfVar2[uVar4] * *(float *)(lVar6 + lVar7 * 4);
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != (int)uVar5);
  }
  f->previous_length = len - right;
  if (0 < (int)uVar5) {
    uVar4 = 0;
    do {
      if (right < len) {
        pfVar2 = f->previous_window[uVar4];
        pfVar3 = f->channel_buffers[uVar4];
        uVar9 = 0;
        do {
          pfVar2[uVar9] = pfVar3[(long)right + uVar9];
          uVar9 = uVar9 + 1;
        } while ((uint)(len - right) != uVar9);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar5);
  }
  if ((ulong)uVar1 == 0) {
    return 0;
  }
LAB_0015e420:
  if (len < right) {
    right = len;
  }
  f->samples_output = f->samples_output + (right - left);
  return right - left;
}

Assistant:

static int vorbis_finish_frame(stb_vorbis *f, int len, int left, int right)
{
   int prev,i,j;
   // we use right&left (the start of the right- and left-window sin()-regions)
   // to determine how much to return, rather than inferring from the rules
   // (same result, clearer code); 'left' indicates where our sin() window
   // starts, therefore where the previous window's right edge starts, and
   // therefore where to start mixing from the previous buffer. 'right'
   // indicates where our sin() ending-window starts, therefore that's where
   // we start saving, and where our returned-data ends.

   // mixin from previous window
   if (f->previous_length) {
      int i,j, n = f->previous_length;
      float *w = get_window(f, n);
      if (w == NULL) return 0;
      for (i=0; i < f->channels; ++i) {
         for (j=0; j < n; ++j)
            f->channel_buffers[i][left+j] =
               f->channel_buffers[i][left+j]*w[    j] +
               f->previous_window[i][     j]*w[n-1-j];
      }
   }

   prev = f->previous_length;

   // last half of this data becomes previous window
   f->previous_length = len - right;

   // @OPTIMIZE: could avoid this copy by double-buffering the
   // output (flipping previous_window with channel_buffers), but
   // then previous_window would have to be 2x as large, and
   // channel_buffers couldn't be temp mem (although they're NOT
   // currently temp mem, they could be (unless we want to level
   // performance by spreading out the computation))
   for (i=0; i < f->channels; ++i)
      for (j=0; right+j < len; ++j)
         f->previous_window[i][j] = f->channel_buffers[i][right+j];

   if (!prev)
      // there was no previous packet, so this data isn't valid...
      // this isn't entirely true, only the would-have-overlapped data
      // isn't valid, but this seems to be what the spec requires
      return 0;

   // truncate a short frame
   if (len < right) right = len;

   f->samples_output += right-left;

   return right - left;
}